

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parsing.h
# Opt level: O2

int __thiscall Parsing::getSymbol(Parsing *this)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  byte *pbVar5;
  ostream *poVar6;
  uint uVar7;
  size_type sVar8;
  long lVar9;
  byte *pbVar10;
  ulong uVar11;
  long lVar12;
  bool bVar13;
  int symbol;
  int number;
  string target;
  string local_50;
  
  filter(this);
  pbVar5 = (byte *)(this->content)._M_dataplus._M_p;
  pbVar10 = pbVar5;
  do {
    target._M_dataplus._M_p = (pointer)&target.field_2;
    sVar8 = (this->content)._M_string_length;
    if (pbVar10 == pbVar5 + sVar8) {
      return 0;
    }
    target._M_string_length = 0;
    target.field_2._M_local_buf[0] = '\0';
    lVar12 = (long)pbVar10 * -0x100000000;
    while( true ) {
      if (pbVar10 == pbVar5 + sVar8) {
        std::__cxx11::string::~string((string *)&target);
        return 0;
      }
      if ((*pbVar10 != 0x20) && (*pbVar10 != 9)) break;
      pbVar10 = pbVar10 + 1;
      lVar12 = lVar12 + -0x100000000;
    }
    bVar1 = *pbVar10;
    uVar11 = (ulong)bVar1;
    if (uVar11 < 0x3f) {
      bVar4 = false;
      bVar13 = true;
      bVar3 = true;
      if ((0xef0800000000U >> (uVar11 & 0x3f) & 1) == 0) {
        bVar3 = false;
        if ((0x7c00000000000000U >> (uVar11 & 0x3f) & 1) == 0) goto LAB_00103b9b;
      }
      else {
LAB_001039b4:
        bVar13 = bVar3;
        bVar3 = '/' < (char)bVar1;
      }
    }
    else {
LAB_00103b9b:
      bVar13 = bVar1 == 0x2c;
      if ((char)bVar1 < '{') {
        if ((char)bVar1 < 'a') {
          if ('Z' < (char)bVar1) goto LAB_00103bd4;
          bVar4 = '@' < (char)bVar1;
          bVar3 = bVar13;
          if ((char)bVar1 < ':') goto LAB_001039b4;
        }
        else {
          bVar4 = true;
        }
      }
      else {
LAB_00103bd4:
        bVar4 = false;
      }
      bVar3 = false;
    }
    for (; ((pbVar10 != pbVar5 + sVar8 && (bVar2 = *pbVar10, bVar2 != 9)) && (bVar2 != 0x20));
        pbVar10 = pbVar10 + 1) {
      uVar7 = (uint)bVar2;
      if ((((bVar4) && (uVar7 < 0x3f)) && ((0x7c00ff0800000000U >> ((ulong)uVar7 & 0x3f) & 1) != 0))
         || ((!(bool)('z' < (char)bVar2 | bVar13 ^ 1U) &&
             (('`' < (char)bVar2 ||
              (((char)bVar2 < '[' && (('@' < (char)bVar2 || ((byte)(bVar2 - 0x30) < 10))))))))))
      break;
      if (bVar3) {
        if ((uVar7 < 0x3f) && ((0x7c00ff0800000000U >> ((ulong)uVar7 & 0x3f) & 1) != 0)) break;
      }
      else {
        uVar7 = bVar2 - 0x23;
        if (((((byte)uVar7 < 0x1c) && ((0xf801fe1U >> (uVar7 & 0x1f) & 1) != 0)) &&
            (target._M_string_length != 0)) &&
           (((target._M_string_length != 1 || ((0x47fe01eU >> (uVar7 & 0x1f) & 1) == 0)) ||
            ((0x3e < bVar1 || ((0x5400000000000000U >> (uVar11 & 0x3f) & 1) == 0)))))) break;
      }
      std::__cxx11::string::push_back((char)&target);
      pbVar5 = (byte *)(this->content)._M_dataplus._M_p;
      sVar8 = (this->content)._M_string_length;
    }
    symbol = getReservation(this,&target);
    number = 0;
    if (symbol == -1) {
      bVar4 = isNumber(this,&target);
      if (bVar4) {
        symbol = this->constBase;
        number = getNumber(&target);
      }
      std::__cxx11::string::string((string *)&local_50,(string *)&target);
      bVar4 = isIdentifier(this,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      if (bVar4) {
        symbol = this->identifierBase;
      }
    }
    lVar12 = (long)(this->content)._M_dataplus._M_p * -0x100000000 - lVar12;
    lVar9 = lVar12 >> 0x1e;
    std::vector<Word,std::allocator<Word>>::emplace_back<std::__cxx11::string&,int&,int&,int&,int&>
              ((vector<Word,std::allocator<Word>> *)&this->words,&target,&symbol,&number,
               (int *)((long)(this->contentLine).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar9),
               (int *)(lVar9 + (long)(this->contentRow).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start));
    if (symbol == -1) {
      poVar6 = std::operator<<((ostream *)&std::cout,"parsing error in ");
      lVar12 = lVar12 >> 0x20;
      poVar6 = (ostream *)
               std::ostream::operator<<
                         (poVar6,(this->contentLine).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start[lVar12]);
      poVar6 = std::operator<<(poVar6,":");
      poVar6 = (ostream *)
               std::ostream::operator<<
                         (poVar6,(this->contentRow).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start[lVar12]);
      std::endl<char,std::char_traits<char>>(poVar6);
      std::__cxx11::string::~string((string *)&target);
      return -1;
    }
    std::__cxx11::string::~string((string *)&target);
    pbVar5 = (byte *)(this->content)._M_dataplus._M_p;
  } while( true );
}

Assistant:

int getSymbol() {
		filter();
		auto now = content.begin();
		while (now != content.end()) {
			std::string target;

			while (now != content.end() && ISSPC(*now)) now++;
			auto nowPosition = now;
			if (now == content.end()) break;

			bool isDiv = ISDIV(*now);
			bool isLet = ISLET(*now);
			bool isNum = ISNUM(*now);
			char doubleDiv = *now;
			while (now != content.end() && ! ISSPC(*now)) {
				if (isLet && ISDIV(*now)) break;
				if (isDiv && (ISLET(*now) || ISNUM(*now))) break;
				if (isNum && ISDIV(*now)) break;
				if (ISDIV(*now)) {
					if (target.length() == 1) {
						if (*now == '='){
							if (doubleDiv != '<' && doubleDiv != '>' && doubleDiv != ':') break;
						} else break;
					} else if (target.length() >= 2) break;
				}
				target += *now;
				now++;
			}

			int symbol = getReservation(target);
			int number = 0;
			if (symbol == -1) {
				if (isNumber(target)) {
					symbol = constBase;
					number = getNumber(target);
				}
				if (isIdentifier(target)) symbol = identifierBase;
			}

			int targetPosition = nowPosition - content.begin();
			words.emplace_back(target, symbol, number, contentLine[targetPosition], contentRow[targetPosition]);

			if (symbol == -1) {
				std::cout << "parsing error in " << contentLine[targetPosition] <<
											 ":" << contentRow[targetPosition] << std::endl;
				return -1;
			}
		}
		return 0;
	}